

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O3

void t8(void)

{
  uint uVar1;
  int iVar2;
  
  puts("Bank read/write tests.");
  gpioWrite(0x19,0);
  uVar1 = gpioRead_Bits_0_31();
  CHECK(8,1,uVar1 & 0x2000000,0,0,"read bank 1");
  gpioWrite(0x19,1);
  uVar1 = gpioRead_Bits_0_31();
  CHECK(8,2,uVar1 & 0x2000000,0x2000000,0,"read bank 1");
  gpioWrite_Bits_0_31_Clear(0x2000000);
  iVar2 = gpioRead(0x19);
  CHECK(8,3,iVar2,0,0,"clear bank 1");
  gpioWrite_Bits_0_31_Set(0x2000000);
  iVar2 = gpioRead(0x19);
  CHECK(8,4,iVar2,1,0,"set bank 1");
  iVar2 = gpioRead_Bits_32_53();
  if (iVar2 == 0) {
    t8_cold_1();
  }
  else {
    printf("TEST %2d.%-2d PASS (%s: %d)\n",8,5);
  }
  iVar2 = gpioWrite_Bits_32_53_Clear(0);
  CHECK(8,6,iVar2,0,0,"clear bank 2");
  printf("TEST %2d.%-2d PASS (%s: %d)\n",8,7);
  iVar2 = gpioWrite_Bits_32_53_Set(0);
  CHECK(8,8,iVar2,0,0,"set bank 2");
  printf("TEST %2d.%-2d PASS (%s: %d)\n",8,9,"NOT APPLICABLE",0);
  return;
}

Assistant:

void t8()
{
   int v;

   printf("Bank read/write tests.\n");

   gpioWrite(GPIO, 0);
   v = gpioRead_Bits_0_31() & (1<<GPIO);
   CHECK(8, 1, v, 0, 0, "read bank 1");

   gpioWrite(GPIO, 1);
   v = gpioRead_Bits_0_31() & (1<<GPIO);
   CHECK(8, 2, v, (1<<GPIO), 0, "read bank 1");

   gpioWrite_Bits_0_31_Clear(1<<GPIO);
   v = gpioRead(GPIO);
   CHECK(8, 3, v, 0, 0, "clear bank 1");

   gpioWrite_Bits_0_31_Set(1<<GPIO);
   v = gpioRead(GPIO);
   CHECK(8, 4, v, 1, 0, "set bank 1");

   v = gpioRead_Bits_32_53();

   if (v) v = 0; else v = 1;

   CHECK(8, 5, v, 0, 0, "read bank 2");

   v = gpioWrite_Bits_32_53_Clear(0);
   CHECK(8, 6, v, 0, 0, "clear bank 2");

   CHECK(8, 7, 0, 0, 0, "NOT APPLICABLE");

   v = gpioWrite_Bits_32_53_Set(0);
   CHECK(8, 8, v, 0, 0, "set bank 2");

   CHECK(8, 9, 0, 0, 0, "NOT APPLICABLE");
}